

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcSymTable.cpp
# Opt level: O0

bool __thiscall GrcSymbolTableEntry::IsAttachAtField(GrcSymbolTableEntry *this)

{
  bool bVar1;
  Symbol this_00;
  Symbol pGVar2;
  GrcSymbolTableEntry *in_RDI;
  Symbol psymParent;
  char *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffef;
  bool bVar3;
  
  this_00 = ParentSymbol(in_RDI);
  bVar1 = FitsSymbolType((GrcSymbolTableEntry *)
                         CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8),
                         (SymbolType)((ulong)in_RDI >> 0x20));
  bVar3 = false;
  if ((bVar1) && (bVar3 = false, this_00 != (Symbol)0x0)) {
    pGVar2 = ParentSymbol(this_00);
    bVar3 = false;
    if (pGVar2 != (Symbol)0x0) {
      ParentSymbol(this_00);
      bVar1 = std::operator==(&in_RDI->m_staFieldName,in_stack_ffffffffffffffd8);
      bVar3 = false;
      if (bVar1) {
        bVar3 = std::operator==(&in_RDI->m_staFieldName,in_stack_ffffffffffffffd8);
      }
    }
  }
  return bVar3;
}

Assistant:

bool GrcSymbolTableEntry::IsAttachAtField()
{
	Assert(FitsSymbolType(ksymtSlotAttr) || FitsSymbolType(ksymtFeature));
	Symbol psymParent = ParentSymbol();
	return (FitsSymbolType(ksymtSlotAttr)
		&& psymParent && psymParent->ParentSymbol()
		&& psymParent->ParentSymbol()->m_staFieldName == "attach"
		&& psymParent->m_staFieldName == "at");
}